

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_paged_audio_buffer_data_init
                    (ma_format format,ma_uint32 channels,ma_paged_audio_buffer_data *pData)

{
  if (pData != (ma_paged_audio_buffer_data *)0x0) {
    pData->format = ma_format_unknown;
    pData->channels = 0;
    (pData->head).pNext = (ma_paged_audio_buffer_page *)0x0;
    (pData->head).sizeInFrames = 0;
    *(undefined8 *)(pData->head).pAudioData = 0;
    pData->format = format;
    pData->channels = channels;
    pData->pTail = &pData->head;
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_init(ma_format format, ma_uint32 channels, ma_paged_audio_buffer_data* pData)
{
    if (pData == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pData);

    pData->format   = format;
    pData->channels = channels;
    pData->pTail    = &pData->head;

    return MA_SUCCESS;
}